

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

void __thiscall ON_SubDFaceNeighborhood::~ON_SubDFaceNeighborhood(ON_SubDFaceNeighborhood *this)

{
  this->m_face0 = (ON_SubDFace *)0x0;
  this->m_center_vertex1 = (ON_SubDVertex *)0x0;
  this->m_face1_count = 0;
  this->m_face1 = (ON_SubDFace **)0x0;
  ON_SubD_FixedSizeHeap::ReserveSubDWorkspace(&this->m_fsh,(ON_SubDFace *)0x0);
  ON_SubD_FixedSizeHeap::~ON_SubD_FixedSizeHeap(&this->m_fsh);
  return;
}

Assistant:

ON_SubDFaceNeighborhood::~ON_SubDFaceNeighborhood()
{
  ReserveCapacity(nullptr);
}